

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_empty.c
# Opt level: O1

int archive_read_support_format_empty(archive *_a)

{
  int iVar1;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_empty");
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    iVar1 = __archive_read_register_format
                      ((archive_read *)_a,(void *)0x0,"empty",archive_read_format_empty_bid,
                       (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                       archive_read_format_empty_read_header,archive_read_format_empty_read_data,
                       (_func_int_archive_read_ptr *)0x0,
                       (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                       (_func_int_archive_read_ptr *)0x0,(_func_int_archive_read_ptr *)0x0,
                       (_func_int_archive_read_ptr *)0x0);
  }
  return iVar1;
}

Assistant:

int
archive_read_support_format_empty(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_empty");

	r = __archive_read_register_format(a,
	    NULL,
	    "empty",
	    archive_read_format_empty_bid,
	    NULL,
	    archive_read_format_empty_read_header,
	    archive_read_format_empty_read_data,
	    NULL,
	    NULL,
	    NULL,
	    NULL,
	    NULL);

	return (r);
}